

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

string * __thiscall
license::base64_abi_cxx11_
          (string *__return_storage_ptr__,license *this,void *binaryData,size_t len,int lineLenght)

{
  license lVar1;
  license lVar2;
  license lVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  char *pcVar7;
  int lineLenght_00;
  uchar BYTE2;
  uchar BYTE1;
  uchar BYTE0;
  size_t totalLength;
  size_t flen;
  int pad;
  int modulusLen;
  uint byteNo;
  uchar *bin;
  int lineLenght_local;
  size_t len_local;
  void *binaryData_local;
  string *encodeBuffer;
  
  lineLenght_00 = (int)len;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = binaryData;
  uVar5 = SUB164(auVar4 % ZEXT816(3),0);
  iVar6 = (uVar5 & 1) * 2 + ((int)(uVar5 & 2) >> 1);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (pad = 0; (ulong)(uint)pad <= (long)binaryData - 3U; pad = pad + 3) {
    lVar1 = this[(uint)pad];
    lVar2 = this[pad + 1];
    lVar3 = this[pad + 2];
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,b64[(byte)lVar1 >> 2]);
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               b64[((byte)lVar1 & 3) << 4 | (uint)((byte)lVar2 >> 4)]);
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               b64[(uint)((byte)lVar3 >> 6) + ((byte)lVar2 & 0xf) * 4]);
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,b64[(byte)lVar3 & 0x3f]);
  }
  if (iVar6 == 2) {
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,b64[(byte)this[(uint)pad] >> 2]);
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,b64[((byte)this[(uint)pad] & 3) << 4]);
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'=');
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'=');
  }
  else if (iVar6 == 1) {
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,b64[(byte)this[(uint)pad] >> 2]);
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               b64[((byte)this[(uint)pad] & 3) << 4 | (uint)((byte)this[pad + 1] >> 4)]);
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,b64[(ulong)((byte)this[pad + 1] & 0xf) * 4]);
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'=');
  }
  if (lineLenght_00 != 0) {
    std::__cxx11::string::length();
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    if (*pcVar7 != '\n') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string base64(const void* binaryData, size_t len, int lineLenght) {
	const unsigned char* bin = (const unsigned char*)binaryData;

	// int rc = 0;  // result counter
	unsigned int byteNo;  // I need this after the loop

	int modulusLen = len % 3;
	int pad = ((modulusLen & 1) << 1) + ((modulusLen & 2) >> 1);  // 2 gives 1 and 1 gives 2, but 0 gives 0.

	const size_t flen = 4 * (len + pad) / 3;
	size_t totalLength = flen;
	if (lineLenght > 0) {
		totalLength += ((int)flen / lineLenght) + 3;
	}

	string encodeBuffer;
	encodeBuffer.reserve(totalLength);

	for (byteNo = 0; byteNo <= len - 3; byteNo += 3) {
		unsigned char BYTE0 = bin[byteNo];
		unsigned char BYTE1 = bin[byteNo + 1];
		unsigned char BYTE2 = bin[byteNo + 2];

		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[BYTE0 >> 2];
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[((0x3 & BYTE0) << 4) + (BYTE1 >> 4)];
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[((0x0f & BYTE1) << 2) + (BYTE2 >> 6)];
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[0x3f & BYTE2];
	}

	if (pad == 2) {
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[bin[byteNo] >> 2];
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[(0x3 & bin[byteNo]) << 4];
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += '=';
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += '=';
	} else if (pad == 1) {
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[bin[byteNo] >> 2];
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[((0x3 & bin[byteNo]) << 4) + (bin[byteNo + 1] >> 4)];
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[(0x0f & bin[byteNo + 1]) << 2];
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += '=';
	}
	if (lineLenght && encodeBuffer[encodeBuffer.length() - 1] != '\n') {
		encodeBuffer += '\n';
	}
	return encodeBuffer;
}